

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcodeinject.hh
# Opt level: O2

string * __thiscall
ExecutablePcode::getSource_abi_cxx11_(string *__return_storage_ptr__,ExecutablePcode *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->source);
  return __return_storage_ptr__;
}

Assistant:

virtual string getSource(void) const { return source; }